

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.c
# Opt level: O2

int nsync_wait_n(void *mu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock,
                nsync_time abs_deadline,int count,nsync_waitable_s **waitable)

{
  int iVar1;
  uint uVar2;
  waiter *w;
  nsync_waiter_s *__ptr;
  ulong uVar3;
  nsync_waiter_s *pnVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  nsync_time a;
  nsync_time nVar9;
  nsync_waiter_s nw_set [4];
  
  uVar6 = (ulong)(uint)count;
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    nVar9 = (*waitable[uVar3]->funcs->ready_time)(waitable[uVar3]->v,(nsync_waiter_s *)0x0);
    iVar1 = nsync_time_cmp(nVar9,(nsync_time)ZEXT816((ulong)0));
    if (iVar1 < 1) {
      return (int)uVar3;
    }
  }
  iVar1 = nsync_time_cmp(abs_deadline,(nsync_time)ZEXT816((ulong)0));
  uVar5 = count;
  if (0 < iVar1) {
    w = nsync_waiter_new_();
    if (count < 5) {
      __ptr = nw_set;
    }
    else {
      __ptr = (nsync_waiter_s *)malloc(uVar6 * 0x38);
    }
    iVar1 = 1;
    uVar3 = 0;
    pnVar4 = __ptr;
    while ((uVar6 != uVar3 && (iVar1 != 0))) {
      pnVar4->tag = 0x726d2ba9;
      pnVar4->sem = &w->sem;
      nsync_dll_init_(&pnVar4->q,pnVar4);
      pnVar4->waiting = 0;
      pnVar4->flags = 0;
      iVar1 = (*waitable[uVar3]->funcs->enqueue)(waitable[uVar3]->v,pnVar4);
      uVar3 = uVar3 + 1;
      pnVar4 = pnVar4 + 1;
    }
    bVar8 = true;
    if (count == (int)uVar3) {
      bVar8 = mu == (void *)0x0;
      if (!bVar8) {
        (*unlock)(mu);
      }
      uVar7 = 0;
      nVar9 = abs_deadline;
      do {
        for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          a = (*waitable[uVar7]->funcs->ready_time)(waitable[uVar7]->v,__ptr + uVar7);
          iVar1 = nsync_time_cmp(a,nVar9);
          if (-1 < iVar1) {
            a = nVar9;
          }
          nVar9 = a;
        }
        iVar1 = nsync_time_cmp(nVar9,(nsync_time)ZEXT816((ulong)0));
        if (iVar1 < 1) break;
        iVar1 = nsync_mu_semaphore_p_with_deadline(&w->sem,nVar9);
        uVar7 = 0;
        nVar9 = abs_deadline;
      } while (iVar1 == 0);
    }
    pnVar4 = __ptr;
    for (uVar7 = 0; uVar5 = (uint)uVar6, uVar3 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = (*waitable[uVar7]->funcs->dequeue)(waitable[uVar7]->v,pnVar4);
      uVar2 = (uint)uVar7;
      if (uVar5 != count || iVar1 != 0) {
        uVar2 = uVar5;
      }
      pnVar4 = pnVar4 + 1;
      uVar6 = (ulong)uVar2;
    }
    if (__ptr != nw_set) {
      free(__ptr);
    }
    nsync_waiter_free_(w);
    if (!bVar8) {
      (*lock)(mu);
    }
  }
  return uVar5;
}

Assistant:

NSYNC_CPP_START_

int nsync_wait_n (void *mu, void (*lock) (void *), void (*unlock) (void *),
		  nsync_time abs_deadline,
		  int count, struct nsync_waitable_s *waitable[]) {
	int ready;
	IGNORE_RACES_START ();
	for (ready = 0; ready != count &&
			nsync_time_cmp ((*waitable[ready]->funcs->ready_time) (
						waitable[ready]->v, NULL),
					nsync_time_zero) > 0;
	     ready++) {
	}
	if (ready == count && nsync_time_cmp (abs_deadline, nsync_time_zero) > 0) {
		int i;
		int unlocked = 0;
		int j;
		int enqueued = 1;
		waiter *w = nsync_waiter_new_ ();
		struct nsync_waiter_s nw_set[4];
		struct nsync_waiter_s *nw = nw_set;
		if (count > (int) (sizeof (nw_set) / sizeof (nw_set[0]))) {
			nw = (struct nsync_waiter_s *) malloc (count * sizeof (nw[0]));
		}
		for (i = 0; i != count && enqueued; i++) {
			nw[i].tag = NSYNC_WAITER_TAG;
			nw[i].sem = &w->sem;
			nsync_dll_init_ (&nw[i].q, &nw[i]);
			ATM_STORE (&nw[i].waiting, 0);
			nw[i].flags = 0;
			enqueued = (*waitable[i]->funcs->enqueue) (waitable[i]->v, &nw[i]);
		}

		if (i == count) {
			nsync_time min_ntime;
			if (mu != NULL) {
				(*unlock) (mu);
				unlocked = 1;
			}
			do {
				min_ntime = abs_deadline;
				for (j = 0; j != count; j++) {
					nsync_time ntime;
					ntime = (*waitable[j]->funcs->ready_time) (
						waitable[j]->v, &nw[j]);
					if (nsync_time_cmp (ntime, min_ntime) < 0) {
						min_ntime = ntime;
					}
				}
			} while (nsync_time_cmp (min_ntime, nsync_time_zero) > 0 &&
				 nsync_mu_semaphore_p_with_deadline (&w->sem,
					min_ntime) == 0);
		}

		/* An attempt was made above to enqueue waitable[0..i-1].
                   Dequeue any that are still enqueued, and remember the index
                   of the first ready (i.e., not still enqueued) object, if any.  */
		for (j = 0; j != i; j++) {
			int was_still_enqueued =
				(*waitable[j]->funcs->dequeue) (waitable[j]->v, &nw[j]);
			if (!was_still_enqueued && ready == count) {
				ready = j;
			}
		}

		if (nw != nw_set) {
			free (nw);
		}
		nsync_waiter_free_ (w);
		if (unlocked) {
			(*lock) (mu);
		}
	}
	IGNORE_RACES_END ();
	return (ready);
}